

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteSparse_config.c
# Opt level: O1

c_float SuiteSparse_hypot(c_float x,c_float y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = ABS(x);
  dVar2 = ABS(y);
  dVar1 = dVar2 + dVar3;
  if (dVar2 <= dVar3) {
    if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) {
      return dVar3;
    }
    dVar1 = (dVar2 / dVar3) * (dVar2 / dVar3);
  }
  else {
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
      return dVar2;
    }
    dVar1 = (dVar3 / dVar2) * (dVar3 / dVar2);
    dVar3 = dVar2;
  }
  dVar1 = dVar1 + 1.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  return dVar3 * dVar1;
}

Assistant:

c_float SuiteSparse_hypot (c_float x, c_float y)
{
    c_float s, r ;
    x = fabs (x) ;
    y = fabs (y) ;
    if (x >= y)
    {
        if (x + y == x)
        {
            s = x ;
        }
        else
        {
            r = y / x ;
            s = x * sqrt (1.0 + r*r) ;
        }
    }
    else
    {
        if (y + x == y)
        {
            s = y ;
        }
        else
        {
            r = x / y ;
            s = y * sqrt (1.0 + r*r) ;
        }
    }
    return (s) ;
}